

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TriTriOverlap.h
# Opt level: O0

BOOL CoplanarTriTri(Point *n,Point *v0,Point *v1,Point *v2,Point *u0,Point *u1,Point *u2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float d2_1;
  float d1_1;
  float d0_1;
  float c_1;
  float b_1;
  float a_1;
  float d2;
  float d1;
  float d0;
  float c;
  float b;
  float a;
  float e_8;
  float e_7;
  float e_6;
  float Ay_2;
  float Ax_2;
  float f_2;
  float d_2;
  float Cy_2;
  float Cx_2;
  float By_2;
  float Bx_2;
  float e_5;
  float e_4;
  float e_3;
  float Ay_1;
  float Ax_1;
  float f_1;
  float d_1;
  float Cy_1;
  float Cx_1;
  float By_1;
  float Bx_1;
  float e_2;
  float e_1;
  float e;
  float Ay;
  float Ax;
  float f;
  float d;
  float Cy;
  float Cx;
  float By;
  float Bx;
  short i1;
  short i0;
  float A [3];
  Point *u1_local;
  Point *u0_local;
  Point *v2_local;
  Point *v1_local;
  Point *v0_local;
  Point *n_local;
  
  fVar1 = ABS(n->x);
  fVar2 = ABS(n->z);
  if (fVar1 <= ABS(n->y)) {
    if (fVar2 <= ABS(n->y)) {
      By._0_2_ = 2;
    }
    else {
      By._0_2_ = 1;
    }
    By._2_2_ = 0;
  }
  else {
    if (fVar1 <= fVar2) {
      By._0_2_ = 1;
    }
    else {
      By._0_2_ = 2;
    }
    By._2_2_ = (ushort)(fVar2 < fVar1);
  }
  fVar1 = (&v1->x)[(short)By._2_2_] - (&v0->x)[(short)By._2_2_];
  fVar2 = (&v1->x)[By._0_2_] - (&v0->x)[By._0_2_];
  fVar3 = (&u0->x)[(short)By._2_2_] - (&u1->x)[(short)By._2_2_];
  fVar4 = (&u0->x)[By._0_2_] - (&u1->x)[By._0_2_];
  fVar5 = (&v0->x)[(short)By._2_2_] - (&u0->x)[(short)By._2_2_];
  fVar6 = (&v0->x)[By._0_2_] - (&u0->x)[By._0_2_];
  fVar7 = fVar2 * fVar3 + -(fVar1 * fVar4);
  fVar3 = fVar4 * fVar5 + -(fVar3 * fVar6);
  if ((((0.0 < fVar7) && (0.0 <= fVar3)) && (fVar3 <= fVar7)) ||
     (((fVar7 < 0.0 && (fVar3 <= 0.0)) && (fVar7 <= fVar3)))) {
    fVar3 = fVar1 * fVar6 + -(fVar2 * fVar5);
    if (fVar7 <= 0.0) {
      if ((fVar3 <= 0.0) && (fVar7 <= fVar3)) {
        return 1;
      }
    }
    else if ((0.0 <= fVar3) && (fVar3 <= fVar7)) {
      return 1;
    }
  }
  fVar3 = (&u1->x)[(short)By._2_2_] - (&u2->x)[(short)By._2_2_];
  fVar4 = (&u1->x)[By._0_2_] - (&u2->x)[By._0_2_];
  fVar5 = (&v0->x)[(short)By._2_2_] - (&u1->x)[(short)By._2_2_];
  fVar6 = (&v0->x)[By._0_2_] - (&u1->x)[By._0_2_];
  fVar7 = fVar2 * fVar3 + -(fVar1 * fVar4);
  fVar3 = fVar4 * fVar5 + -(fVar3 * fVar6);
  if ((((0.0 < fVar7) && (0.0 <= fVar3)) && (fVar3 <= fVar7)) ||
     (((fVar7 < 0.0 && (fVar3 <= 0.0)) && (fVar7 <= fVar3)))) {
    fVar3 = fVar1 * fVar6 + -(fVar2 * fVar5);
    if (fVar7 <= 0.0) {
      if ((fVar3 <= 0.0) && (fVar7 <= fVar3)) {
        return 1;
      }
    }
    else if ((0.0 <= fVar3) && (fVar3 <= fVar7)) {
      return 1;
    }
  }
  fVar3 = (&u2->x)[(short)By._2_2_] - (&u0->x)[(short)By._2_2_];
  fVar4 = (&u2->x)[By._0_2_] - (&u0->x)[By._0_2_];
  fVar5 = (&v0->x)[(short)By._2_2_] - (&u2->x)[(short)By._2_2_];
  fVar6 = (&v0->x)[By._0_2_] - (&u2->x)[By._0_2_];
  fVar7 = fVar2 * fVar3 + -(fVar1 * fVar4);
  fVar3 = fVar4 * fVar5 + -(fVar3 * fVar6);
  if ((((0.0 < fVar7) && (0.0 <= fVar3)) && (fVar3 <= fVar7)) ||
     (((fVar7 < 0.0 && (fVar3 <= 0.0)) && (fVar7 <= fVar3)))) {
    fVar1 = fVar1 * fVar6 + -(fVar2 * fVar5);
    if (fVar7 <= 0.0) {
      if ((fVar1 <= 0.0) && (fVar7 <= fVar1)) {
        return 1;
      }
    }
    else if ((0.0 <= fVar1) && (fVar1 <= fVar7)) {
      return 1;
    }
  }
  fVar1 = (&v2->x)[(short)By._2_2_] - (&v1->x)[(short)By._2_2_];
  fVar2 = (&v2->x)[By._0_2_] - (&v1->x)[By._0_2_];
  fVar3 = (&u0->x)[(short)By._2_2_] - (&u1->x)[(short)By._2_2_];
  fVar4 = (&u0->x)[By._0_2_] - (&u1->x)[By._0_2_];
  fVar5 = (&v1->x)[(short)By._2_2_] - (&u0->x)[(short)By._2_2_];
  fVar6 = (&v1->x)[By._0_2_] - (&u0->x)[By._0_2_];
  fVar7 = fVar2 * fVar3 + -(fVar1 * fVar4);
  fVar3 = fVar4 * fVar5 + -(fVar3 * fVar6);
  if ((((0.0 < fVar7) && (0.0 <= fVar3)) && (fVar3 <= fVar7)) ||
     (((fVar7 < 0.0 && (fVar3 <= 0.0)) && (fVar7 <= fVar3)))) {
    fVar3 = fVar1 * fVar6 + -(fVar2 * fVar5);
    if (fVar7 <= 0.0) {
      if ((fVar3 <= 0.0) && (fVar7 <= fVar3)) {
        return 1;
      }
    }
    else if ((0.0 <= fVar3) && (fVar3 <= fVar7)) {
      return 1;
    }
  }
  fVar3 = (&u1->x)[(short)By._2_2_] - (&u2->x)[(short)By._2_2_];
  fVar4 = (&u1->x)[By._0_2_] - (&u2->x)[By._0_2_];
  fVar5 = (&v1->x)[(short)By._2_2_] - (&u1->x)[(short)By._2_2_];
  fVar6 = (&v1->x)[By._0_2_] - (&u1->x)[By._0_2_];
  fVar7 = fVar2 * fVar3 + -(fVar1 * fVar4);
  fVar3 = fVar4 * fVar5 + -(fVar3 * fVar6);
  if ((((0.0 < fVar7) && (0.0 <= fVar3)) && (fVar3 <= fVar7)) ||
     (((fVar7 < 0.0 && (fVar3 <= 0.0)) && (fVar7 <= fVar3)))) {
    fVar3 = fVar1 * fVar6 + -(fVar2 * fVar5);
    if (fVar7 <= 0.0) {
      if ((fVar3 <= 0.0) && (fVar7 <= fVar3)) {
        return 1;
      }
    }
    else if ((0.0 <= fVar3) && (fVar3 <= fVar7)) {
      return 1;
    }
  }
  fVar3 = (&u2->x)[(short)By._2_2_] - (&u0->x)[(short)By._2_2_];
  fVar4 = (&u2->x)[By._0_2_] - (&u0->x)[By._0_2_];
  fVar5 = (&v1->x)[(short)By._2_2_] - (&u2->x)[(short)By._2_2_];
  fVar6 = (&v1->x)[By._0_2_] - (&u2->x)[By._0_2_];
  fVar7 = fVar2 * fVar3 + -(fVar1 * fVar4);
  fVar3 = fVar4 * fVar5 + -(fVar3 * fVar6);
  if ((((0.0 < fVar7) && (0.0 <= fVar3)) && (fVar3 <= fVar7)) ||
     (((fVar7 < 0.0 && (fVar3 <= 0.0)) && (fVar7 <= fVar3)))) {
    fVar1 = fVar1 * fVar6 + -(fVar2 * fVar5);
    if (fVar7 <= 0.0) {
      if ((fVar1 <= 0.0) && (fVar7 <= fVar1)) {
        return 1;
      }
    }
    else if ((0.0 <= fVar1) && (fVar1 <= fVar7)) {
      return 1;
    }
  }
  fVar1 = (&v0->x)[(short)By._2_2_] - (&v2->x)[(short)By._2_2_];
  fVar2 = (&v0->x)[By._0_2_] - (&v2->x)[By._0_2_];
  fVar3 = (&u0->x)[(short)By._2_2_] - (&u1->x)[(short)By._2_2_];
  fVar4 = (&u0->x)[By._0_2_] - (&u1->x)[By._0_2_];
  fVar5 = (&v2->x)[(short)By._2_2_] - (&u0->x)[(short)By._2_2_];
  fVar6 = (&v2->x)[By._0_2_] - (&u0->x)[By._0_2_];
  fVar7 = fVar2 * fVar3 + -(fVar1 * fVar4);
  fVar3 = fVar4 * fVar5 + -(fVar3 * fVar6);
  if ((((0.0 < fVar7) && (0.0 <= fVar3)) && (fVar3 <= fVar7)) ||
     (((fVar7 < 0.0 && (fVar3 <= 0.0)) && (fVar7 <= fVar3)))) {
    fVar3 = fVar1 * fVar6 + -(fVar2 * fVar5);
    if (fVar7 <= 0.0) {
      if ((fVar3 <= 0.0) && (fVar7 <= fVar3)) {
        return 1;
      }
    }
    else if ((0.0 <= fVar3) && (fVar3 <= fVar7)) {
      return 1;
    }
  }
  fVar3 = (&u1->x)[(short)By._2_2_] - (&u2->x)[(short)By._2_2_];
  fVar4 = (&u1->x)[By._0_2_] - (&u2->x)[By._0_2_];
  fVar5 = (&v2->x)[(short)By._2_2_] - (&u1->x)[(short)By._2_2_];
  fVar6 = (&v2->x)[By._0_2_] - (&u1->x)[By._0_2_];
  fVar7 = fVar2 * fVar3 + -(fVar1 * fVar4);
  fVar3 = fVar4 * fVar5 + -(fVar3 * fVar6);
  if ((((0.0 < fVar7) && (0.0 <= fVar3)) && (fVar3 <= fVar7)) ||
     (((fVar7 < 0.0 && (fVar3 <= 0.0)) && (fVar7 <= fVar3)))) {
    fVar3 = fVar1 * fVar6 + -(fVar2 * fVar5);
    if (fVar7 <= 0.0) {
      if ((fVar3 <= 0.0) && (fVar7 <= fVar3)) {
        return 1;
      }
    }
    else if ((0.0 <= fVar3) && (fVar3 <= fVar7)) {
      return 1;
    }
  }
  fVar3 = (&u2->x)[(short)By._2_2_] - (&u0->x)[(short)By._2_2_];
  fVar4 = (&u2->x)[By._0_2_] - (&u0->x)[By._0_2_];
  fVar5 = (&v2->x)[(short)By._2_2_] - (&u2->x)[(short)By._2_2_];
  fVar6 = (&v2->x)[By._0_2_] - (&u2->x)[By._0_2_];
  fVar7 = fVar2 * fVar3 + -(fVar1 * fVar4);
  fVar3 = fVar4 * fVar5 + -(fVar3 * fVar6);
  if ((((0.0 < fVar7) && (0.0 <= fVar3)) && (fVar3 <= fVar7)) ||
     (((fVar7 < 0.0 && (fVar3 <= 0.0)) && (fVar7 <= fVar3)))) {
    fVar1 = fVar1 * fVar6 + -(fVar2 * fVar5);
    if (fVar7 <= 0.0) {
      if ((fVar1 <= 0.0) && (fVar7 <= fVar1)) {
        return 1;
      }
    }
    else if ((0.0 <= fVar1) && (fVar1 <= fVar7)) {
      return 1;
    }
  }
  fVar2 = (&u1->x)[By._0_2_] - (&u0->x)[By._0_2_];
  fVar1 = -((&u1->x)[(short)By._2_2_] - (&u0->x)[(short)By._2_2_]);
  fVar3 = fVar2 * (&v0->x)[(short)By._2_2_] + fVar1 * (&v0->x)[By._0_2_] +
          -fVar2 * (&u0->x)[(short)By._2_2_] + -(fVar1 * (&u0->x)[By._0_2_]);
  fVar4 = (&u2->x)[By._0_2_] - (&u1->x)[By._0_2_];
  fVar1 = -((&u2->x)[(short)By._2_2_] - (&u1->x)[(short)By._2_2_]);
  fVar5 = (&u0->x)[By._0_2_] - (&u2->x)[By._0_2_];
  fVar2 = -((&u0->x)[(short)By._2_2_] - (&u2->x)[(short)By._2_2_]);
  if ((fVar3 * (fVar4 * (&v0->x)[(short)By._2_2_] + fVar1 * (&v0->x)[By._0_2_] +
               -fVar4 * (&u1->x)[(short)By._2_2_] + -(fVar1 * (&u1->x)[By._0_2_])) <= 0.0) ||
     (fVar3 * (fVar5 * (&v0->x)[(short)By._2_2_] + fVar2 * (&v0->x)[By._0_2_] +
              -fVar5 * (&u2->x)[(short)By._2_2_] + -(fVar2 * (&u2->x)[By._0_2_])) <= 0.0)) {
    fVar2 = (&v1->x)[By._0_2_] - (&v0->x)[By._0_2_];
    fVar1 = -((&v1->x)[(short)By._2_2_] - (&v0->x)[(short)By._2_2_]);
    fVar3 = fVar2 * (&u0->x)[(short)By._2_2_] + fVar1 * (&u0->x)[By._0_2_] +
            -fVar2 * (&v0->x)[(short)By._2_2_] + -(fVar1 * (&v0->x)[By._0_2_]);
    fVar4 = (&v2->x)[By._0_2_] - (&v1->x)[By._0_2_];
    fVar1 = -((&v2->x)[(short)By._2_2_] - (&v1->x)[(short)By._2_2_]);
    fVar5 = (&v0->x)[By._0_2_] - (&v2->x)[By._0_2_];
    fVar2 = -((&v0->x)[(short)By._2_2_] - (&v2->x)[(short)By._2_2_]);
    if ((fVar3 * (fVar4 * (&u0->x)[(short)By._2_2_] + fVar1 * (&u0->x)[By._0_2_] +
                 -fVar4 * (&v1->x)[(short)By._2_2_] + -(fVar1 * (&v1->x)[By._0_2_])) <= 0.0) ||
       (fVar3 * (fVar5 * (&u0->x)[(short)By._2_2_] + fVar2 * (&u0->x)[By._0_2_] +
                -fVar5 * (&v2->x)[(short)By._2_2_] + -(fVar2 * (&v2->x)[By._0_2_])) <= 0.0)) {
      n_local._4_4_ = 0;
    }
    else {
      n_local._4_4_ = 1;
    }
  }
  else {
    n_local._4_4_ = 1;
  }
  return n_local._4_4_;
}

Assistant:

BOOL CoplanarTriTri(const Point& n, const Point& v0, const Point& v1, const Point& v2, const Point& u0, const Point& u1, const Point& u2)
{
	float A[3];
	short i0,i1;
	/* first project onto an axis-aligned plane, that maximizes the area */
	/* of the triangles, compute indices: i0,i1. */
	A[0] = fabsf(n[0]);
	A[1] = fabsf(n[1]);
	A[2] = fabsf(n[2]);
	if(A[0]>A[1])
	{
		if(A[0]>A[2])
		{
			i0=1;      /* A[0] is greatest */
			i1=2;
		}
		else
		{
			i0=0;      /* A[2] is greatest */
			i1=1;
		}
	}
	else   /* A[0]<=A[1] */
	{
		if(A[2]>A[1])
		{
			i0=0;      /* A[2] is greatest */
			i1=1;
		}
		else
		{
			i0=0;      /* A[1] is greatest */
			i1=2;
		}
	}

	/* test all edges of triangle 1 against the edges of triangle 2 */
	EDGE_AGAINST_TRI_EDGES(v0, v1, u0, u1, u2);
	EDGE_AGAINST_TRI_EDGES(v1, v2, u0, u1, u2);
	EDGE_AGAINST_TRI_EDGES(v2, v0, u0, u1, u2);

	/* finally, test if tri1 is totally contained in tri2 or vice versa */
	POINT_IN_TRI(v0, u0, u1, u2);
	POINT_IN_TRI(u0, v0, v1, v2);

	return FALSE;
}